

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

string * __thiscall
r_code::ReadString_abi_cxx11_(string *__return_storage_ptr__,r_code *this,uint32_t *data)

{
  r_code rVar1;
  r_code *prVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this[4] != (r_code)0x0) {
    prVar2 = this + 5;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      rVar1 = *prVar2;
      prVar2 = prVar2 + 1;
    } while (rVar1 != (r_code)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReadString(uint32_t *data)
{
    std::string ret;
    char *content = (char *)(data + 1);

    for (size_t i = 0; content[i] != 0; ++i) {
        ret += content[i];
    }

    return ret;
}